

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixer_sse.cpp
# Opt level: O2

float * Resample_<BSincTag,SSETag>
                  (InterpState *state,float *src,uint frac,uint increment,
                  span<float,_18446744073709551615UL> dst)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float fVar6;
  uint uVar7;
  float *pfVar8;
  long lVar9;
  long lVar10;
  iterator __begin1;
  float *pfVar11;
  long lVar12;
  float *pfVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  
  pfVar8 = (state->bsinc).filter;
  fVar6 = (state->bsinc).sf;
  uVar7 = (state->bsinc).m;
  uVar14 = (ulong)uVar7;
  pfVar13 = src + -(ulong)(state->bsinc).l;
  for (pfVar11 = dst.mData; pfVar11 != dst.mDataEnd; pfVar11 = pfVar11 + 1) {
    fVar17 = (float)(frac & 0x7f) * 0.0078125;
    lVar16 = (ulong)(frac >> 7) * uVar14 * 0x10;
    lVar9 = uVar14 * 4 + lVar16;
    lVar10 = uVar14 * 4 + lVar9;
    fVar18 = 0.0;
    fVar19 = 0.0;
    fVar20 = 0.0;
    fVar21 = 0.0;
    lVar12 = 0;
    uVar15 = (ulong)(uVar7 >> 2);
    do {
      pfVar1 = (float *)((long)pfVar8 + lVar12 + lVar10);
      pfVar2 = (float *)((long)pfVar8 + lVar12 + lVar16);
      pfVar5 = (float *)((long)pfVar8 + lVar12 + uVar14 * 4 + lVar10);
      pfVar3 = (float *)((long)pfVar8 + lVar12 + lVar9);
      pfVar4 = (float *)((long)pfVar13 + lVar12);
      fVar18 = fVar18 + *pfVar4 * ((*pfVar5 * fVar6 + *pfVar3) * fVar17 + *pfVar1 * fVar6 + *pfVar2)
      ;
      fVar19 = fVar19 + pfVar4[1] *
                        ((pfVar5[1] * fVar6 + pfVar3[1]) * fVar17 + pfVar1[1] * fVar6 + pfVar2[1]);
      fVar20 = fVar20 + pfVar4[2] *
                        ((pfVar5[2] * fVar6 + pfVar3[2]) * fVar17 + pfVar1[2] * fVar6 + pfVar2[2]);
      fVar21 = fVar21 + pfVar4[3] *
                        ((pfVar5[3] * fVar6 + pfVar3[3]) * fVar17 + pfVar1[3] * fVar6 + pfVar2[3]);
      lVar12 = lVar12 + 0x10;
      uVar15 = uVar15 - 1;
    } while (uVar15 != 0);
    *pfVar11 = fVar19 + fVar20 + fVar21 + fVar18;
    pfVar13 = pfVar13 + (frac + increment >> 0xc);
    frac = frac + increment & 0xfff;
  }
  return dst.mData;
}

Assistant:

const float *Resample_<BSincTag,SSETag>(const InterpState *state, const float *RESTRICT src,
    uint frac, uint increment, const al::span<float> dst)
{
    const float *const filter{state->bsinc.filter};
    const __m128 sf4{_mm_set1_ps(state->bsinc.sf)};
    const size_t m{state->bsinc.m};

    src -= state->bsinc.l;
    for(float &out_sample : dst)
    {
        // Calculate the phase index and factor.
        const uint pi{frac >> FracPhaseBitDiff};
        const float pf{static_cast<float>(frac & (FracPhaseDiffOne-1)) * (1.0f/FracPhaseDiffOne)};

        // Apply the scale and phase interpolated filter.
        __m128 r4{_mm_setzero_ps()};
        {
            const __m128 pf4{_mm_set1_ps(pf)};
            const float *fil{filter + m*pi*4};
            const float *phd{fil + m};
            const float *scd{phd + m};
            const float *spd{scd + m};
            size_t td{m >> 2};
            size_t j{0u};

            do {
                /* f = ((fil + sf*scd) + pf*(phd + sf*spd)) */
                const __m128 f4 = MLA4(
                    MLA4(_mm_load_ps(&fil[j]), sf4, _mm_load_ps(&scd[j])),
                    pf4, MLA4(_mm_load_ps(&phd[j]), sf4, _mm_load_ps(&spd[j])));
                /* r += f*src */
                r4 = MLA4(r4, f4, _mm_loadu_ps(&src[j]));
                j += 4;
            } while(--td);
        }
        r4 = _mm_add_ps(r4, _mm_shuffle_ps(r4, r4, _MM_SHUFFLE(0, 1, 2, 3)));
        r4 = _mm_add_ps(r4, _mm_movehl_ps(r4, r4));
        out_sample = _mm_cvtss_f32(r4);

        frac += increment;
        src  += frac>>MixerFracBits;
        frac &= MixerFracMask;
    }
    return dst.data();
}